

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O2

void absl::cord_internal::CordRep::Destroy(CordRep *rep)

{
  uint __line;
  bool bVar1;
  CordRepSubstring *pCVar2;
  CordRepBtree *tree;
  CordRepCrc *node;
  char *__assertion;
  
  if (rep != (CordRep *)0x0) {
    do {
      if (((rep->refcount).count_.super___atomic_base<int>._M_i & 1U) != 0) {
        __assertion = "!rep->refcount.IsImmortal()";
        __line = 0x2b;
        goto LAB_0015ba23;
      }
      switch(rep->tag) {
      case '\x01':
        pCVar2 = substring(rep);
        rep = pCVar2->child;
        operator_delete(pCVar2,0x20);
        bVar1 = RefcountAndFlags::Decrement(&rep->refcount);
        if (bVar1) {
          return;
        }
        break;
      case '\x02':
        node = crc(rep);
        CordRepCrc::Destroy(node);
        return;
      case '\x03':
        tree = btree(rep);
        CordRepBtree::Destroy(tree);
        return;
      default:
        if (5 < rep->tag) {
          CordRepFlat::Delete(rep);
          return;
        }
        __assertion = "rep->IsFlat()";
        __line = 0x3d;
        goto LAB_0015ba23;
      case '\x05':
        CordRepExternal::Delete(rep);
        return;
      }
    } while( true );
  }
  __assertion = "rep != nullptr";
  __line = 0x28;
LAB_0015ba23:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                ,__line,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
}

Assistant:

void CordRep::Destroy(CordRep* rep) {
  assert(rep != nullptr);

  while (true) {
    assert(!rep->refcount.IsImmortal());
    if (rep->tag == BTREE) {
      CordRepBtree::Destroy(rep->btree());
      return;
    } else if (rep->tag == EXTERNAL) {
      CordRepExternal::Delete(rep);
      return;
    } else if (rep->tag == SUBSTRING) {
      CordRepSubstring* rep_substring = rep->substring();
      rep = rep_substring->child;
      delete rep_substring;
      if (rep->refcount.Decrement()) {
        return;
      }
    } else if (rep->tag == CRC) {
      CordRepCrc::Destroy(rep->crc());
      return;
    } else {
      assert(rep->IsFlat());
      CordRepFlat::Delete(rep);
      return;
    }
  }
}